

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O3

void __thiscall
QAccessibleTable::modelChange(QAccessibleTable *this,QAccessibleTableModelChangeEvent *event)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  char cVar7;
  int iVar8;
  int iVar9;
  long *plVar10;
  long lVar11;
  QAccessibleTableHeaderCell *cell;
  Data *pDVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  Id id;
  uint local_4c;
  QHash<int,_unsigned_int> local_48;
  int local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar12 = (this->childToId).d;
  if ((pDVar12 != (Data *)0x0) && (pDVar12->size != 0)) {
    iVar1 = *(int *)(event + 0x1c);
    if (iVar1 - 2U < 2) {
      iVar1 = *(int *)(event + 0x28);
      iVar4 = *(int *)(event + 0x20);
      iVar9 = *(int *)(event + 0x24);
      iVar5 = *(int *)(event + 0x2c);
      local_48.d = (Data *)0x0;
      if (pDVar12->spans->offsets[0] == 0xff) {
        uVar6 = 1;
        do {
          uVar13 = uVar6;
          if (pDVar12->numBuckets == uVar13) {
            pDVar12 = (Data *)0x0;
            uVar13 = 0;
            break;
          }
          uVar6 = uVar13 + 1;
        } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
        if (uVar13 == 0 && pDVar12 == (Data *)0x0) goto LAB_005299e1;
      }
      else {
        uVar13 = 0;
      }
      do {
        local_4c = *(uint *)(pDVar12->spans[uVar13 >> 7].entries
                             [pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f]].storage.data
                            + 4);
        plVar10 = (long *)QAccessible::accessibleInterface(local_4c);
        iVar8 = *(int *)(event + 0x1c);
        if (iVar8 == 2) {
          iVar8 = (**(code **)(*plVar10 + 0x78))(plVar10);
          if (iVar8 != 0x1a) {
            iVar8 = *(int *)(event + 0x1c);
            goto LAB_005297bd;
          }
          if (*(int *)(event + 0x20) <= (int)plVar10[3]) {
            iVar8 = (int)plVar10[3] + (iVar1 - iVar4) + 1;
            goto LAB_005297dd;
          }
        }
        else {
LAB_005297bd:
          if (((iVar8 == 3) && (iVar8 = (**(code **)(*plVar10 + 0x78))(plVar10), iVar8 == 0x19)) &&
             (*(int *)(event + 0x24) <= (int)plVar10[3])) {
            iVar8 = (int)plVar10[3] + (iVar5 - iVar9) + 1;
LAB_005297dd:
            *(int *)(plVar10 + 3) = iVar8;
          }
        }
        iVar8 = (**(code **)(*(long *)this + 0xf0))(this,plVar10);
        if (iVar8 < 0) {
          QAccessible::deleteAccessibleInterface(local_4c);
        }
        else {
          local_3c = (**(code **)(*(long *)this + 0xf0))(this,plVar10);
          QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                    ((QHash<int,unsigned_int> *)&local_48,&local_3c,&local_4c);
        }
        do {
          if (pDVar12->numBuckets - 1 == uVar13) {
            uVar13 = 0;
            pDVar12 = (Data *)0x0;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
      } while ((uVar13 != 0) || (pDVar12 != (Data *)0x0));
    }
    else {
      if (1 < iVar1 - 4U) {
        if (iVar1 != 0) goto LAB_005299fb;
        if (pDVar12->spans->offsets[0] == 0xff) {
          uVar6 = 1;
          do {
            uVar13 = uVar6;
            if (pDVar12->numBuckets == uVar13) {
              pDVar12 = (Data *)0x0;
              uVar13 = 0;
              break;
            }
            uVar6 = uVar13 + 1;
          } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
          if (uVar13 != 0 || pDVar12 != (Data *)0x0) goto LAB_00529a62;
        }
        else {
          uVar13 = 0;
LAB_00529a62:
          do {
            QAccessible::deleteAccessibleInterface
                      (*(uint *)(pDVar12->spans[uVar13 >> 7].entries
                                 [pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f]].storage.
                                 data + 4));
            do {
              if (pDVar12->numBuckets - 1 == uVar13) {
                uVar13 = 0;
                pDVar12 = (Data *)0x0;
                break;
              }
              uVar13 = uVar13 + 1;
            } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
          } while ((uVar13 != 0) || (pDVar12 != (Data *)0x0));
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          QHash<int,_unsigned_int>::clear(&this->childToId);
          return;
        }
        goto LAB_00529afa;
      }
      uVar2 = *(uint *)(event + 0x2c);
      iVar1 = *(int *)(event + 0x24);
      uVar3 = *(uint *)(event + 0x28);
      iVar4 = *(int *)(event + 0x20);
      local_48.d = (Data *)0x0;
      if (pDVar12->spans->offsets[0] == 0xff) {
        uVar6 = 1;
        do {
          uVar13 = uVar6;
          if (pDVar12->numBuckets == uVar13) {
            pDVar12 = (Data *)0x0;
            uVar13 = 0;
            break;
          }
          uVar6 = uVar13 + 1;
        } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
        if (uVar13 == 0 && pDVar12 == (Data *)0x0) goto LAB_005299e1;
      }
      else {
        uVar13 = 0;
      }
      do {
        local_4c = *(uint *)(pDVar12->spans[uVar13 >> 7].entries
                             [pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f]].storage.data
                            + 4);
        plVar10 = (long *)QAccessible::accessibleInterface(local_4c);
        iVar9 = (**(code **)(*plVar10 + 0x78))(plVar10);
        if ((iVar9 == 0x1d) || (iVar9 = (**(code **)(*plVar10 + 0x78))(plVar10), iVar9 == 0x22)) {
          lVar11 = (**(code **)(*plVar10 + 0xa0))(plVar10,6);
          plVar10 = (long *)(lVar11 + -8);
          if (lVar11 == 0) {
            plVar10 = (long *)0x0;
          }
          cVar7 = QPersistentModelIndex::isValid();
          if (cVar7 != '\0') goto LAB_00529909;
LAB_0052998e:
          QAccessible::deleteAccessibleInterface(local_4c);
        }
        else {
          iVar9 = *(int *)(event + 0x1c);
          if (iVar9 == 4) {
            iVar9 = (**(code **)(*plVar10 + 0x78))(plVar10);
            if (iVar9 != 0x1a) {
              iVar9 = *(int *)(event + 0x1c);
              goto LAB_00529960;
            }
            iVar9 = (int)plVar10[3];
            if (iVar9 < *(int *)(event + 0x20)) goto LAB_00529909;
            if (iVar9 <= *(int *)(event + 0x28)) goto LAB_0052998e;
            iVar9 = iVar9 + ~uVar3 + iVar4;
          }
          else {
LAB_00529960:
            if ((iVar9 != 5) || (iVar9 = (**(code **)(*plVar10 + 0x78))(plVar10), iVar9 != 0x19))
            goto LAB_00529997;
            iVar9 = (int)plVar10[3];
            if (iVar9 < *(int *)(event + 0x24)) goto LAB_00529909;
            if (iVar9 <= *(int *)(event + 0x2c)) goto LAB_0052998e;
            iVar9 = iVar9 + ~uVar2 + iVar1;
          }
          *(int *)(plVar10 + 3) = iVar9;
LAB_00529909:
          local_3c = (**(code **)(*(long *)this + 0xf0))(this,plVar10);
          QHash<int,unsigned_int>::emplace<unsigned_int_const&>
                    ((QHash<int,unsigned_int> *)&local_48,&local_3c,&local_4c);
        }
LAB_00529997:
        do {
          if (pDVar12->numBuckets - 1 == uVar13) {
            uVar13 = 0;
            pDVar12 = (Data *)0x0;
            break;
          }
          uVar13 = uVar13 + 1;
        } while (pDVar12->spans[uVar13 >> 7].offsets[(uint)uVar13 & 0x7f] == 0xff);
      } while ((uVar13 != 0) || (pDVar12 != (Data *)0x0));
    }
LAB_005299e1:
    QHash<int,_unsigned_int>::operator=(&this->childToId,&local_48);
    QHash<int,_unsigned_int>::~QHash(&local_48);
  }
LAB_005299fb:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00529afa:
  __stack_chk_fail();
}

Assistant:

void QAccessibleTable::modelChange(QAccessibleTableModelChangeEvent *event)
{
    // if there is no cache yet, we don't update anything
    if (childToId.isEmpty())
        return;

    switch (event->modelChangeType()) {
    case QAccessibleTableModelChangeEvent::ModelReset:
        for (QAccessible::Id id : std::as_const(childToId))
            QAccessible::deleteAccessibleInterface(id);
        childToId.clear();
        break;

    // rows are inserted: move every row after that
    case QAccessibleTableModelChangeEvent::RowsInserted:
    case QAccessibleTableModelChangeEvent::ColumnsInserted: {
        int newRows = event->lastRow() - event->firstRow() + 1;
        int newColumns = event->lastColumn() - event->firstColumn() + 1;

        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();

        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsInserted
                && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstRow()) {
                    cell->index += newRows;
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsInserted
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index >= event->firstColumn()) {
                    cell->index += newColumns;
                }
            }
            if (indexOfChild(iface) >= 0) {
                newCache.insert(indexOfChild(iface), id);
            } else {
                // ### This should really not happen,
                // but it might if the view has a root index set.
                // This needs to be fixed.
                QAccessible::deleteAccessibleInterface(id);
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::ColumnsRemoved:
    case QAccessibleTableModelChangeEvent::RowsRemoved: {
        int deletedColumns = event->lastColumn() - event->firstColumn() + 1;
        int deletedRows = event->lastRow() - event->firstRow() + 1;
        ChildCache newCache;
        ChildCache::ConstIterator iter = childToId.constBegin();
        while (iter != childToId.constEnd()) {
            QAccessible::Id id = iter.value();
            QAccessibleInterface *iface = QAccessible::accessibleInterface(id);
            Q_ASSERT(iface);
            if (iface->role() == QAccessible::Cell || iface->role() == QAccessible::ListItem) {
                Q_ASSERT(iface->tableCellInterface());
                QAccessibleTableCell *cell = static_cast<QAccessibleTableCell*>(iface->tableCellInterface());
                // Since it is a QPersistentModelIndex, we only need to check if it is valid
                if (cell->m_index.isValid())
                    newCache.insert(indexOfChild(cell), id);
                else
                    QAccessible::deleteAccessibleInterface(id);
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::RowsRemoved
                       && iface->role() == QAccessible::RowHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstRow()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastRow()) {
                    cell->index -= deletedRows;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            } else if (event->modelChangeType() == QAccessibleTableModelChangeEvent::ColumnsRemoved
                   && iface->role() == QAccessible::ColumnHeader) {
                QAccessibleTableHeaderCell *cell = static_cast<QAccessibleTableHeaderCell*>(iface);
                if (cell->index < event->firstColumn()) {
                    newCache.insert(indexOfChild(cell), id);
                } else if (cell->index > event->lastColumn()) {
                    cell->index -= deletedColumns;
                    newCache.insert(indexOfChild(cell), id);
                } else {
                    QAccessible::deleteAccessibleInterface(id);
                }
            }
            ++iter;
        }
        childToId = newCache;
        break;
    }

    case QAccessibleTableModelChangeEvent::DataChanged:
        // nothing to do in this case
        break;
    }
}